

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_a.cpp
# Opt level: O1

void msd_A(cacheblock_t *cache,size_t N,size_t cache_depth,size_t true_depth)

{
  undefined8 *puVar1;
  uchar *puVar2;
  int iVar3;
  uchar *puVar4;
  void *__src;
  long lVar5;
  cacheblock_t *pcVar6;
  size_t sVar7;
  uint i;
  long lVar8;
  cacheblock_t *pcVar9;
  byte bVar10;
  byte bVar11;
  size_t bucketsize [256];
  size_t local_838 [257];
  
  if (N < 0x20) {
    if (1 < (long)N) {
      pcVar6 = cache;
      do {
        puVar4 = pcVar6[1].ptr;
        pcVar6 = pcVar6 + 1;
        for (pcVar9 = pcVar6; cache < pcVar9; pcVar9 = pcVar9 + -1) {
          puVar2 = pcVar9[-1].ptr;
          bVar10 = puVar2[true_depth];
          bVar11 = puVar4[true_depth];
          if ((bVar10 != 0) && (lVar5 = true_depth + 1, bVar10 == bVar11)) {
            do {
              bVar10 = puVar2[lVar5];
              bVar11 = puVar4[lVar5];
              if (bVar10 == 0) break;
              lVar5 = lVar5 + 1;
            } while (bVar10 == bVar11);
          }
          if (bVar10 <= bVar11) break;
          pcVar9->ptr = puVar2;
        }
        iVar3 = (int)N;
        pcVar9->ptr = puVar4;
        N = (size_t)(iVar3 - 1);
      } while (2 < iVar3);
    }
  }
  else {
    if (3 < cache_depth) {
      fill_cache(cache,N,true_depth);
      cache_depth = 0;
    }
    memset(local_838,0,0x800);
    puVar4 = cache->bytes + cache_depth;
    lVar8 = N + (N == 0);
    lVar5 = lVar8;
    do {
      local_838[*puVar4] = local_838[*puVar4] + 1;
      puVar4 = puVar4 + 0x10;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
    __src = malloc(N << 4);
    msd_A::bucketindex[0] = 0;
    lVar5 = 0;
    sVar7 = 0;
    do {
      sVar7 = sVar7 + local_838[lVar5];
      msd_A::bucketindex[lVar5 + 1] = sVar7;
      lVar5 = lVar5 + 1;
      pcVar6 = cache;
    } while (lVar5 != 0xff);
    do {
      sVar7 = msd_A::bucketindex[pcVar6->bytes[cache_depth]];
      msd_A::bucketindex[pcVar6->bytes[cache_depth]] = sVar7 + 1;
      puVar4 = pcVar6->ptr;
      puVar1 = (undefined8 *)((long)__src + sVar7 * 0x10);
      *puVar1 = *(undefined8 *)pcVar6;
      puVar1[1] = puVar4;
      lVar8 = lVar8 + -1;
      pcVar6 = pcVar6 + 1;
    } while (lVar8 != 0);
    memcpy(cache,__src,N << 4);
    free(__src);
    lVar5 = 1;
    do {
      sVar7 = local_838[lVar5];
      if (sVar7 != 0) {
        msd_A(cache + local_838[0],sVar7,cache_depth + 1,true_depth + 1);
        local_838[0] = local_838[0] + sVar7;
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x100);
  }
  return;
}

Assistant:

static void
msd_A(cacheblock_t* cache, size_t N, size_t cache_depth, size_t true_depth)
{
	if (N < 32) {
		inssort_cache(cache, N, true_depth);
		return;
	}
	if (cache_depth >= CACHED_BYTES) {
		fill_cache(cache, N, true_depth);
		cache_depth = 0;
	}
	size_t bucketsize[256] = {0};
	for (size_t i=0; i < N; ++i)
		++bucketsize[cache[i].bytes[cache_depth]];
	cacheblock_t* sorted = (cacheblock_t*)
		malloc(N*sizeof(cacheblock_t));
	static size_t bucketindex[256];
	bucketindex[0] = 0;
	for (unsigned i=1; i < 256; ++i)
		bucketindex[i] = bucketindex[i-1] + bucketsize[i-1];
	for (size_t i=0; i < N; ++i)
		memcpy(&sorted[bucketindex[cache[i].bytes[cache_depth]]++],
				cache+i, sizeof(cacheblock_t));
	memcpy(cache, sorted, N*sizeof(cacheblock_t));
	free(sorted);
	size_t bsum = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_A(cache+bsum, bucketsize[i],
			  cache_depth+1, true_depth+1);
		bsum += bucketsize[i];
	}
}